

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcalc.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  __uid_t __uid;
  char *line;
  allocator local_139;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string homeDir;
  Calculator calculator;
  
  Calculator::Calculator(&calculator,(ostream *)&std::cout);
  std::__cxx11::string::string((string *)&homeDir,"",(allocator *)&local_138);
  __uid = getuid();
  getpwuid(__uid);
  std::__cxx11::string::assign((char *)&homeDir);
  std::operator+(&local_138,&homeDir,"/default.termcalc");
  Calculator::loadFile(&calculator,&local_138,false);
  std::__cxx11::string::~string((string *)&local_138);
  while( true ) {
    line = linenoise("> ");
    if (line == (char *)0x0) break;
    linenoiseHistoryAdd(line);
    std::__cxx11::string::string((string *)&local_138,line,&local_139);
    bVar1 = Calculator::execute(&calculator,&local_138,true);
    std::__cxx11::string::~string((string *)&local_138);
    if (bVar1) break;
    free(line);
  }
  std::__cxx11::string::~string((string *)&homeDir);
  Calculator::~Calculator(&calculator);
  return 0;
}

Assistant:

int main() {
	Calculator calculator;
	std::string homeDir = "";

	#ifdef __unix__
	struct passwd *pw = getpwuid(getuid());
	homeDir = pw->pw_dir;
	#endif

	#if defined(_WIN64) || defined(__MINGW32__)
	PWSTR path = nullptr;
	if (SUCCEEDED(SHGetKnownFolderPath(FOLDERID_Profile, 0, nullptr, &path))) {
		using convert_typeX = std::codecvt_utf8<wchar_t>;
		std::wstring_convert<convert_typeX, wchar_t> converterX;
		homeDir = converterX.to_bytes(std::wstring(path));
	}
	CoTaskMemFree(path);
	#endif

	calculator.loadFile(homeDir + "/default.termcalc", false);

	#if __unix__
		char* line;
		while((line = linenoise("> ")) != nullptr) {
			linenoiseHistoryAdd(line);
			if (calculator.execute(line)) {
				break;
			}
			free(line);
		}
	#else
		std::string line;
		while (std::cin) {
			std::cout << "> ";
			std::getline(std::cin, line);
			if (calculator.execute(line)) {
				break;
			}
		}
	#endif
}